

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::MissingCommandTask::inputsAvailable
          (MissingCommandTask *this,TaskInterface ti)

{
  TaskInterface ti_local;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  BuildValue local_88;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  local_88.stringValues.contents = (char *)0x0;
  local_88.stringValues.size = 0;
  local_88.valueData._64_8_ = 0;
  local_88.valueData._72_8_ = 0;
  local_88.valueData._48_8_ = 0;
  local_88.valueData._56_8_ = 0;
  local_88.valueData.asOutputInfo.modTime.seconds = 0;
  local_88.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_88.valueData.asOutputInfo.mode = 0;
  local_88.valueData.asOutputInfo.size = 0;
  local_88.valueData.asOutputInfo.device = 0;
  local_88.valueData.asOutputInfo.inode = 0;
  local_88.kind = Invalid;
  local_88.numOutputInfos = 0;
  local_88.signature.value = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_a0,&local_88);
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&local_a0,true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // A missing command always builds to an invalid value, and forces
    // downstream clients to be rebuilt (at which point they will presumably see
    // the command is no longer used).
    return ti.complete(BuildValue::makeInvalid().toData(),
                       /*forceChange=*/true);
  }